

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

ENCODING * XmlInitUnknownEncoding(void *mem,int *table,CONVERTER convert,void *userData)

{
  byte bVar1;
  int iVar2;
  uint local_48;
  int c;
  unknown_encoding *e;
  int i;
  void *userData_local;
  CONVERTER convert_local;
  int *table_local;
  void *mem_local;
  
  for (e._4_4_ = 0; (int)e._4_4_ < 0x1d0; e._4_4_ = e._4_4_ + 1) {
    *(undefined1 *)((long)mem + (long)(int)e._4_4_) =
         *(undefined1 *)((long)latin1_encoding.enc.scanners + (long)(int)e._4_4_);
  }
  for (e._4_4_ = 0; (int)e._4_4_ < 0x80; e._4_4_ = e._4_4_ + 1) {
    if (((latin1_encoding.type[(int)e._4_4_] != '\x1c') &&
        (latin1_encoding.type[(int)e._4_4_] != '\0')) && (table[(int)e._4_4_] != e._4_4_)) {
      return (ENCODING *)0x0;
    }
  }
  e._4_4_ = 0;
  do {
    if (0xff < (int)e._4_4_) {
      *(void **)((long)mem + 0x1d8) = userData;
      *(CONVERTER *)((long)mem + 0x1d0) = convert;
      if (convert != (CONVERTER)0x0) {
        *(code **)((long)mem + 0x188) = unknown_isName;
        *(code **)((long)mem + 400) = unknown_isName;
        *(code **)((long)mem + 0x198) = unknown_isName;
        *(code **)((long)mem + 0x1a0) = unknown_isNmstrt;
        *(code **)((long)mem + 0x1a8) = unknown_isNmstrt;
        *(code **)((long)mem + 0x1b0) = unknown_isNmstrt;
        *(code **)((long)mem + 0x1b8) = unknown_isInvalid;
        *(code **)((long)mem + 0x1c0) = unknown_isInvalid;
        *(code **)((long)mem + 0x1c8) = unknown_isInvalid;
      }
      *(code **)((long)mem + 0x70) = unknown_toUtf8;
      *(code **)((long)mem + 0x78) = unknown_toUtf16;
      return (ENCODING *)mem;
    }
    local_48 = table[(int)e._4_4_];
    if (local_48 == 0xffffffff) {
      *(undefined1 *)((long)mem + (long)(int)e._4_4_ + 0x88) = 1;
      *(undefined2 *)((long)mem + (long)(int)e._4_4_ * 2 + 0x1e0) = 0xffff;
      *(undefined1 *)((long)mem + (long)(int)e._4_4_ * 4 + 0x3e0) = 1;
      *(undefined1 *)((long)mem + (long)(int)e._4_4_ * 4 + 0x3e1) = 0;
    }
    else {
      bVar1 = (byte)local_48;
      if ((int)local_48 < 0) {
        if ((int)local_48 < -4) {
          return (ENCODING *)0x0;
        }
        *(byte *)((long)mem + (long)(int)e._4_4_ + 0x88) = '\x05' - (bVar1 + 2);
        *(undefined1 *)((long)mem + (long)(int)e._4_4_ * 4 + 0x3e0) = 0;
        *(undefined2 *)((long)mem + (long)(int)e._4_4_ * 2 + 0x1e0) = 0;
      }
      else if ((int)local_48 < 0x80) {
        if (((latin1_encoding.type[(int)local_48] != '\x1c') &&
            (latin1_encoding.type[(int)local_48] != '\0')) && (local_48 != e._4_4_)) {
          return (ENCODING *)0x0;
        }
        *(uchar *)((long)mem + (long)(int)e._4_4_ + 0x88) = latin1_encoding.type[(int)local_48];
        *(undefined1 *)((long)mem + (long)(int)e._4_4_ * 4 + 0x3e0) = 1;
        *(byte *)((long)mem + (long)(int)e._4_4_ * 4 + 0x3e1) = bVar1;
        if (local_48 == 0) {
          local_48 = 0xffff;
        }
        *(short *)((long)mem + (long)(int)e._4_4_ * 2 + 0x1e0) = (short)local_48;
      }
      else {
        iVar2 = checkCharRefNumber(local_48);
        if (iVar2 < 0) {
          *(undefined1 *)((long)mem + (long)(int)e._4_4_ + 0x88) = 0;
          *(undefined2 *)((long)mem + (long)(int)e._4_4_ * 2 + 0x1e0) = 0xffff;
          *(undefined1 *)((long)mem + (long)(int)e._4_4_ * 4 + 0x3e0) = 1;
          *(undefined1 *)((long)mem + (long)(int)e._4_4_ * 4 + 0x3e1) = 0;
        }
        else {
          if (0xffff < (int)local_48) {
            return (ENCODING *)0x0;
          }
          if ((namingBitmap
               [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[(int)local_48 >> 8] * 8 +
                     ((int)(local_48 & 0xff) >> 5))] & 1 << (bVar1 & 0x1f)) == 0) {
            if ((namingBitmap
                 [(int)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[(int)local_48 >> 8] * 8 +
                       ((int)(local_48 & 0xff) >> 5))] & 1 << (bVar1 & 0x1f)) == 0) {
              *(undefined1 *)((long)mem + (long)(int)e._4_4_ + 0x88) = 0x1c;
            }
            else {
              *(undefined1 *)((long)mem + (long)(int)e._4_4_ + 0x88) = 0x1a;
            }
          }
          else {
            *(undefined1 *)((long)mem + (long)(int)e._4_4_ + 0x88) = 0x16;
          }
          iVar2 = XmlUtf8Encode(local_48,(char *)((long)mem + (long)(int)e._4_4_ * 4 + 0x3e1));
          *(char *)((long)mem + (long)(int)e._4_4_ * 4 + 0x3e0) = (char)iVar2;
          *(short *)((long)mem + (long)(int)e._4_4_ * 2 + 0x1e0) = (short)local_48;
        }
      }
    }
    e._4_4_ = e._4_4_ + 1;
  } while( true );
}

Assistant:

ENCODING *
XmlInitUnknownEncoding(void *mem,
                       int *table,
                       CONVERTER convert,
                       void *userData)
{
  int i;
  struct unknown_encoding *e = (struct unknown_encoding *)mem;
  for (i = 0; i < (int)sizeof(struct normal_encoding); i++)
    ((char *)mem)[i] = ((char *)&latin1_encoding)[i];
  for (i = 0; i < 128; i++)
    if (latin1_encoding.type[i] != BT_OTHER
        && latin1_encoding.type[i] != BT_NONXML
        && table[i] != i)
      return 0;
  for (i = 0; i < 256; i++) {
    int c = table[i];
    if (c == -1) {
      e->normal.type[i] = BT_MALFORM;
      /* This shouldn't really get used. */
      e->utf16[i] = 0xFFFF;
      e->utf8[i][0] = 1;
      e->utf8[i][1] = 0;
    }
    else if (c < 0) {
      if (c < -4)
        return 0;
      e->normal.type[i] = (unsigned char)(BT_LEAD2 - (c + 2));
      e->utf8[i][0] = 0;
      e->utf16[i] = 0;
    }
    else if (c < 0x80) {
      if (latin1_encoding.type[c] != BT_OTHER
          && latin1_encoding.type[c] != BT_NONXML
          && c != i)
        return 0;
      e->normal.type[i] = latin1_encoding.type[c];
      e->utf8[i][0] = 1;
      e->utf8[i][1] = (char)c;
      e->utf16[i] = (unsigned short)(c == 0 ? 0xFFFF : c);
    }
    else if (checkCharRefNumber(c) < 0) {
      e->normal.type[i] = BT_NONXML;
      /* This shouldn't really get used. */
      e->utf16[i] = 0xFFFF;
      e->utf8[i][0] = 1;
      e->utf8[i][1] = 0;
    }
    else {
      if (c > 0xFFFF)
        return 0;
      if (UCS2_GET_NAMING(nmstrtPages, c >> 8, c & 0xff))
        e->normal.type[i] = BT_NMSTRT;
      else if (UCS2_GET_NAMING(namePages, c >> 8, c & 0xff))
        e->normal.type[i] = BT_NAME;
      else
        e->normal.type[i] = BT_OTHER;
      e->utf8[i][0] = (char)XmlUtf8Encode(c, e->utf8[i] + 1);
      e->utf16[i] = (unsigned short)c;
    }
  }
  e->userData = userData;
  e->convert = convert;
  if (convert) {
    e->normal.isName2 = unknown_isName;
    e->normal.isName3 = unknown_isName;
    e->normal.isName4 = unknown_isName;
    e->normal.isNmstrt2 = unknown_isNmstrt;
    e->normal.isNmstrt3 = unknown_isNmstrt;
    e->normal.isNmstrt4 = unknown_isNmstrt;
    e->normal.isInvalid2 = unknown_isInvalid;
    e->normal.isInvalid3 = unknown_isInvalid;
    e->normal.isInvalid4 = unknown_isInvalid;
  }
  e->normal.enc.utf8Convert = unknown_toUtf8;
  e->normal.enc.utf16Convert = unknown_toUtf16;
  return &(e->normal.enc);
}